

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Layer *pLVar8;
  _func_int **pp_Var9;
  int _w;
  ParamDict pd;
  Mat local_70;
  
  pp_Var9 = this->_vptr_ConvolutionDepthWise_x86_fma;
  p_Var1 = pp_Var9[-3];
  if (*(int *)(&this->field_0x160 + (long)p_Var1) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var1)) {
  case 1:
    pLVar8 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_70);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  case 2:
    pLVar8 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_70);
    ParamDict::set((ParamDict *)&local_70,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  case 3:
    pLVar8 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_70);
    ParamDict::set((ParamDict *)&local_70,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_70,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  case 4:
    pLVar8 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_70);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  case 5:
    pLVar8 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_70);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  case 6:
    pLVar8 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_70);
    ParamDict::set((ParamDict *)&local_70,0,**(float **)(&this->field_0x118 + (long)p_Var1));
    ParamDict::set((ParamDict *)&local_70,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var1) + 4));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_70);
    break;
  default:
    pLVar8 = (Layer *)0x0;
    goto LAB_0041defd;
  }
  ParamDict::~ParamDict((ParamDict *)&local_70);
  (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
  pp_Var9 = this->_vptr_ConvolutionDepthWise_x86_fma;
LAB_0041defd:
  this->activation = pLVar8;
  p_Var1 = pp_Var9[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x178 + (long)p_Var1) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) * *(int *)(&this->field_0xd4 + (long)p_Var1);
  _h = *(uint *)(&this->field_0x108 + (long)p_Var1);
  uVar5 = (long)*(int *)(&this->field_0x104 + (long)p_Var1) / (long)(int)_h;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)_w;
  lVar4 = (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var1) / (int)_h);
  uVar5 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
  if ((_h == *(uint *)(&this->field_0xd0 + (long)p_Var1)) && ((int)((long)uVar5 / lVar4) * _h == _h)
     ) {
    if (opt->use_packing_layout == true) {
      if ((_h & 7) == 0) {
        Mat::reshape(&local_70,(Mat *)(&this->field_0x168 + (long)p_Var1),_w,_h,(Allocator *)0x0);
        convert_packing(&local_70,&this->weight_data_tm,8,opt);
        if (local_70.refcount == (int *)0x0) goto LAB_0041e051;
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount != 0) goto LAB_0041e051;
        if (local_70.allocator != (Allocator *)0x0) {
          (*(local_70.allocator)->_vptr_Allocator[3])();
          goto LAB_0041e051;
        }
      }
      else {
        if ((_h & 3) != 0) goto LAB_0041df9d;
        Mat::reshape(&local_70,(Mat *)(&this->field_0x168 + (long)p_Var1),_w,_h,(Allocator *)0x0);
        convert_packing(&local_70,&this->weight_data_tm,4,opt);
        if (local_70.refcount == (int *)0x0) goto LAB_0041e051;
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount != 0) goto LAB_0041e051;
        if (local_70.allocator != (Allocator *)0x0) {
          (*(local_70.allocator)->_vptr_Allocator[3])();
          goto LAB_0041e051;
        }
      }
      if (local_70.data != (void *)0x0) {
        free(local_70.data);
      }
      goto LAB_0041e051;
    }
LAB_0041df9d:
    if ((*(int *)(&this->field_0xd8 + (long)p_Var1) == 3 &&
         *(int *)(&this->field_0xd4 + (long)p_Var1) == 3) &&
       (((((*(int *)(&this->field_0xdc + (long)p_Var1) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var1) == 1)) &&
          (*(int *)(&this->field_0xe4 + (long)p_Var1) == 1)) &&
         (*(int *)(&this->field_0xe8 + (long)p_Var1) == 1)) ||
        (((*(int *)(&this->field_0xdc + (long)p_Var1) == 1 &&
          (*(int *)(&this->field_0xe0 + (long)p_Var1) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var1) == 2 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var1) == 2)))))))) {
      if (p_Var1 != (_func_int *)0xfffffffffffffec0) {
        piVar2 = *(int **)(&this->field_0x170 + (long)p_Var1);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data_tm).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            __ptr = (this->weight_data_tm).data;
            pAVar3 = (this->weight_data_tm).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,(long)uVar5 % lVar4 & 0xffffffff);
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar2 = *(int **)((long)(&this->field_0x168 + (long)p_Var1) + 8);
        (this->weight_data_tm).data = *(void **)(&this->field_0x168 + (long)p_Var1);
        (this->weight_data_tm).refcount = piVar2;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var1);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x180 + (long)p_Var1);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var1);
        uVar6 = *(undefined8 *)(&this->field_0x190 + (long)p_Var1);
        uVar7 = *(undefined8 *)((long)(&this->field_0x190 + (long)p_Var1) + 8);
        (this->weight_data_tm).dims = (int)uVar6;
        (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
        (this->weight_data_tm).h = (int)uVar7;
        (this->weight_data_tm).d = (int)((ulong)uVar7 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x1a0 + (long)p_Var1);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x1a8 + (long)p_Var1);
      }
      goto LAB_0041e051;
    }
  }
  create_group_ops(this,opt);
LAB_0041e051:
  if (opt->lightmode == true) {
    p_Var1 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    piVar2 = *(int **)(&this->field_0x170 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x188 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x168 + (long)p_Var1) != (void *)0x0) {
            free(*(void **)(&this->field_0x168 + (long)p_Var1));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}